

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool __thiscall
ON_SubDimple::LocalSubdivide(ON_SubDimple *this,ON_SubDFace **face_list,size_t face_list_count)

{
  ON_ComponentStatus *pOVar1;
  byte bVar2;
  char cVar3;
  ushort uVar4;
  ON_SubDLevel **ppOVar5;
  long lVar6;
  ON_SubDFace *pOVar7;
  ON_SubDEdgeSharpness OVar8;
  double dVar9;
  ON_3dPoint vertex_location;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  double *pdVar16;
  ON_SubDEdge *this_00;
  ON_SubDVertex *pOVar17;
  ON_SubDFace *pOVar18;
  int iVar19;
  ON_SubDEdge *edge;
  ON_SubDEdgePtr *pOVar20;
  ulong uVar21;
  ulong uVar22;
  size_t sVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  ON_SubDVertex *v1;
  uint fei;
  long lVar28;
  ON_SubDEdge *pOVar29;
  ON_SubDLevel *pOVar30;
  bool bVar31;
  bool bVar32;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double sharpness0;
  ON_3dPoint P;
  ON_SubDEdge *r;
  ON_SimpleArray<ON_SubDEdge_*> radial_edges;
  ON_SimpleArray<ON_SubDEdgePtr> fbdry;
  ON_SimpleArray<ON_3dPoint> edge_points;
  ON_SimpleArray<ON_3dPoint> face_points;
  ON_SimpleArray<ON_SubDEdge_*> edges;
  ON_SimpleArray<ON_SubDFace_*> faces;
  uint local_16c;
  ON_3dPoint local_138;
  ON_SubDLevel *local_120;
  undefined1 local_118 [16];
  ON_3dPoint local_108;
  ulong local_f0;
  ON_SubDHeap *local_e0;
  undefined8 local_d8;
  float fStack_d0;
  float fStack_cc;
  ulong local_c8;
  ON_SimpleArray<ON_SubDEdge_*> local_c0;
  ON_SimpleArray<ON_SubDEdgePtr> local_a8;
  ON_SimpleArray<ON_3dPoint> local_90;
  ON_SimpleArray<ON_3dPoint> local_78;
  ON_SimpleArray<ON_SubDEdge_*> local_60;
  ON_SimpleArray<ON_SubDFace_*> local_48;
  
  if ((face_list_count != 0 && face_list != (ON_SubDFace **)0x0) &&
     (uVar14 = (this->m_levels).m_count, uVar14 != 0)) {
    if (face_list_count == 0) {
      uVar27 = 0xffffffff;
    }
    else {
      uVar27 = 0xffffffff;
      lVar28 = 0;
      do {
        pOVar18 = face_list[lVar28];
        if ((pOVar18 == (ON_SubDFace *)0x0) || (pOVar18->m_edge_count < 3)) {
          bVar31 = false;
        }
        else {
          bVar2 = (pOVar18->super_ON_SubDComponentBase).m_level;
          bVar31 = bVar2 < uVar14;
          if (bVar2 < uVar14) {
            uVar27 = (ulong)bVar2;
          }
        }
      } while ((!bVar31) && (bVar31 = face_list_count - 1 != lVar28, lVar28 = lVar28 + 1, bVar31));
    }
    uVar26 = (uint)uVar27;
    if ((uVar26 < uVar14) &&
       (((this->m_levels).m_a[uVar27] != (ON_SubDLevel *)0x0 &&
        (ClearHigherSubdivisionLevels(this,uVar26 + 1), uVar26 + 1 == (this->m_levels).m_count)))) {
      ppOVar5 = (this->m_levels).m_a;
      pOVar30 = ppOVar5[uVar27];
      this->m_active_level = pOVar30;
      if ((pOVar30 != (ON_SubDLevel *)0x0) && (pOVar30->m_face_count != 0)) {
        pOVar30 = ppOVar5[uVar27];
        this->m_active_level = pOVar30;
        ON_SubDLevel::ClearRuntimeMarks(pOVar30,true,true,true);
        if (face_list_count == 0) {
          uVar14 = 0;
          bVar31 = true;
          sVar23 = 0;
          bVar32 = true;
        }
        else {
          local_16c = 0;
          uVar14 = 0;
          uVar15 = 0;
          sVar23 = 0;
          local_120 = pOVar30;
          do {
            pOVar18 = face_list[sVar23];
            iVar12 = 7;
            if (((pOVar18 != (ON_SubDFace *)0x0) && (2 < pOVar18->m_edge_count)) &&
               (uVar26 == (pOVar18->super_ON_SubDComponentBase).m_level)) {
              pOVar1 = &(pOVar18->super_ON_SubDComponentBase).m_status;
              bVar31 = ON_ComponentStatus::RuntimeMark(pOVar1);
              if (bVar31) {
                iVar12 = 7;
              }
              else {
                ON_ComponentStatus::SetRuntimeMark(pOVar1);
                pdVar16 = ON_3dPoint::operator_cast_to_double_(&local_138);
                bVar31 = ON_SubDFace::GetSubdivisionPoint(pOVar18,pdVar16);
                if (bVar31) {
                  iVar19 = 8;
                  if (pOVar18->m_edge_count != 0) {
                    pOVar20 = pOVar18->m_edge4;
                    iVar12 = 0;
                    do {
                      if (((short)iVar12 == 4) &&
                         (pOVar20 = pOVar18->m_edgex, pOVar20 == (ON_SubDEdgePtr *)0x0)) {
                        ON_SubDIncrementErrorCount();
                        iVar19 = 1;
                        break;
                      }
                      local_118._0_4_ = iVar12;
                      pOVar29 = (ON_SubDEdge *)(pOVar20->m_ptr & 0xfffffffffffffff8);
                      if (((pOVar29 == (ON_SubDEdge *)0x0) ||
                          (pOVar29->m_vertex[0] == (ON_SubDVertex *)0x0)) ||
                         (pOVar29->m_vertex[1] == (ON_SubDVertex *)0x0)) {
                        ON_SubDIncrementErrorCount();
                        iVar19 = 1;
                      }
                      else {
                        pOVar1 = &(pOVar29->super_ON_SubDComponentBase).m_status;
                        bVar31 = ON_ComponentStatus::RuntimeMark(pOVar1);
                        iVar19 = 10;
                        if (!bVar31) {
                          ON_SubDEdge::UpdateEdgeSectorCoefficientsForExperts(pOVar29,true);
                          ON_ComponentStatus::SetRuntimeMark(pOVar1);
                          pdVar16 = ON_3dPoint::operator_cast_to_double_(&local_138);
                          bVar31 = ON_SubDEdge::GetSubdivisionPoint(pOVar29,pdVar16);
                          if (bVar31) {
                            lVar28 = 0;
                            bVar31 = false;
                            do {
                              bVar32 = ON_ComponentStatus::RuntimeMark
                                                 (&(pOVar29->m_vertex[lVar28]->
                                                   super_ON_SubDComponentBase).m_status);
                              if (!bVar32) {
                                ON_ComponentStatus::SetRuntimeMark
                                          (&(pOVar29->m_vertex[lVar28]->super_ON_SubDComponentBase).
                                            m_status);
                                local_d8 = pOVar29->m_vertex[lVar28];
                                pdVar16 = ON_3dPoint::operator_cast_to_double_(&local_138);
                                bVar32 = ON_SubDVertex::GetSubdivisionPoint(local_d8,pdVar16);
                                if (!bVar32) {
                                  ON_SubDIncrementErrorCount();
                                  iVar19 = 1;
                                  goto LAB_005e6953;
                                }
                                uVar15 = uVar15 + 1;
                              }
                              lVar28 = lVar28 + 1;
                              bVar31 = lVar28 != 1;
                            } while (lVar28 == 1);
                            iVar19 = 0;
LAB_005e6953:
                            uVar14 = uVar14 + bVar31;
                          }
                          else {
                            ON_SubDIncrementErrorCount();
                            iVar19 = 1;
                          }
                        }
                      }
                      if ((iVar19 != 10) && (iVar19 != 0)) break;
                      iVar12 = local_118._0_4_ + 1;
                      pOVar20 = pOVar20 + 1;
                      iVar19 = 8;
                    } while ((ushort)iVar12 < pOVar18->m_edge_count);
                  }
                  iVar12 = iVar19;
                  if (iVar19 == 8) {
                    iVar12 = 0;
                  }
                  local_16c = local_16c + (iVar19 == 8);
                }
                else {
                  ON_SubDIncrementErrorCount();
                  iVar12 = 1;
                }
              }
            }
            if ((iVar12 != 7) && (iVar12 != 0)) goto LAB_005e69e1;
            sVar23 = sVar23 + 1;
          } while (sVar23 != face_list_count);
          iVar12 = 5;
LAB_005e69e1:
          bVar32 = iVar12 == 5;
          bVar31 = uVar15 < 3;
          sVar23 = (size_t)local_16c;
          pOVar30 = local_120;
        }
        if (!bVar32) {
          return false;
        }
        uVar15 = (uint)sVar23;
        if ((bool)((uVar14 < 3 || uVar15 == 0) | bVar31)) {
          return false;
        }
        if (pOVar30->m_face_count <= uVar15) {
          uVar14 = GlobalSubdivide(this);
          return uVar14 != 0;
        }
        local_48._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00828c70;
        local_48.m_a = (ON_SubDFace **)0x0;
        local_48.m_count = 0;
        local_48.m_capacity = 0;
        if (uVar15 != 0) {
          ON_SimpleArray<ON_SubDFace_*>::SetCapacity(&local_48,sVar23);
        }
        local_78._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008179f8;
        local_78.m_a = (ON_3dPoint *)0x0;
        local_78.m_count = 0;
        local_78.m_capacity = 0;
        if (uVar15 != 0) {
          ON_SimpleArray<ON_3dPoint>::SetCapacity(&local_78,sVar23);
        }
        ChangeGeometryContentSerialNumber(this,false);
        pOVar18 = pOVar30->m_face[0];
        local_120 = pOVar30;
        if (pOVar18 != (ON_SubDFace *)0x0) {
          do {
            bVar31 = ON_ComponentStatus::RuntimeMark
                               (&(pOVar18->super_ON_SubDComponentBase).m_status);
            if (bVar31) {
              local_108.x = (double)pOVar18;
              ON_SimpleArray<ON_SubDFace_*>::Append(&local_48,(ON_SubDFace **)&local_108);
              ON_SubDFace::SubdivisionPoint(&local_108,pOVar18);
              local_138.z = local_108.z;
              local_138.x = local_108.x;
              local_138.y = local_108.y;
              bVar31 = ON_3dPoint::IsValid(&local_138);
              if (!bVar31) {
                ON_SubDIncrementErrorCount();
                goto LAB_005e7330;
              }
              ON_SimpleArray<ON_3dPoint>::Append(&local_78,&local_138);
            }
            pOVar18 = pOVar18->m_next_face;
          } while (pOVar18 != (ON_SubDFace *)0x0);
        }
        if (uVar15 == local_78.m_count) {
          uVar25 = (ulong)uVar14;
          local_90._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008179f8;
          local_90.m_a = (ON_3dPoint *)0x0;
          local_90.m_count = 0;
          local_90.m_capacity = 0;
          if (uVar14 != 0) {
            ON_SimpleArray<ON_3dPoint>::SetCapacity(&local_90,uVar25);
          }
          pOVar30 = local_120;
          local_e0 = (ON_SubDHeap *)&PTR__ON_SimpleArray_00828cb0;
          local_60._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00828cb0;
          local_60.m_a = (ON_SubDEdge **)0x0;
          local_60.m_count = 0;
          local_60.m_capacity = 0;
          if (uVar14 != 0) {
            ON_SimpleArray<ON_SubDEdge_*>::SetCapacity(&local_60,uVar25);
          }
          pOVar18 = (ON_SubDFace *)pOVar30->m_edge[0];
          if (pOVar18 != (ON_SubDFace *)0x0) {
            do {
              bVar31 = ON_ComponentStatus::RuntimeMark
                                 (&(pOVar18->super_ON_SubDComponentBase).m_status);
              if (bVar31) {
                cVar3 = (char)pOVar18->m_reserved1;
                if ((((cVar3 == '\x04') || (cVar3 == '\x01')) && ((short)pOVar18->m_pack_id == 2))
                   && (uVar13 = ON_SubDEdge::MarkedFaceCount((ON_SubDEdge *)pOVar18), uVar13 == 2))
                {
                  ON_SubDEdge::SubdivisionPoint(&local_108,(ON_SubDEdge *)pOVar18);
                }
                else {
                  ON_SubDEdge::ControlNetCenterPoint(&local_108,(ON_SubDEdge *)pOVar18);
                }
                local_138.z = local_108.z;
                local_138.x = local_108.x;
                local_138.y = local_108.y;
                ON_SimpleArray<ON_3dPoint>::Append(&local_90,&local_138);
                local_108.x = (double)pOVar18;
                ON_SimpleArray<ON_SubDEdge_*>::Append(&local_60,(ON_SubDEdge **)&local_108);
              }
              pOVar18 = pOVar18->m_next_face;
            } while (pOVar18 != (ON_SubDFace *)0x0);
          }
          if (uVar14 == local_90.m_count) {
            pOVar17 = local_120->m_vertex[0];
            if (pOVar17 != (ON_SubDVertex *)0x0) {
              do {
                bVar31 = ON_ComponentStatus::RuntimeMark
                                   (&(pOVar17->super_ON_SubDComponentBase).m_status);
                if (((bVar31) && (uVar4 = pOVar17->m_edge_count, 1 < uVar4)) &&
                   (uVar13 = ON_SubDVertex::MarkedEdgeCount(pOVar17), uVar13 == uVar4)) {
                  ON_SubDVertex::SubdivisionPoint(&local_108,pOVar17);
                  local_138.z = local_108.z;
                  local_138.x = local_108.x;
                  local_138.y = local_108.y;
                  pOVar17->m_P[0] = local_108.x;
                  pOVar17->m_P[1] = local_108.y;
                  pOVar17->m_P[2] = local_108.z;
                }
                pOVar17 = pOVar17->m_next_vertex;
              } while (pOVar17 != (ON_SubDVertex *)0x0);
            }
            if (uVar14 != 0) {
              uVar24 = 0;
              do {
                pOVar29 = local_60.m_a[uVar24];
                OVar8 = ON_SubDEdge::Sharpness(pOVar29,false);
                local_118._8_4_ = extraout_XMM0_Dc;
                local_118._0_4_ = OVar8.m_edge_sharpness[0];
                local_118._4_4_ = OVar8.m_edge_sharpness[1];
                local_118._12_4_ = extraout_XMM0_Dd;
                ON_SubDEdge::EdgeModifiedNofification(pOVar29);
                uVar10 = local_90.m_a[uVar24].x;
                uVar11 = local_90.m_a[uVar24].y;
                vertex_location.y = (double)uVar11;
                vertex_location.x = (double)uVar10;
                vertex_location.z = local_90.m_a[uVar24].z;
                this_00 = SplitEdge(this,pOVar29,vertex_location);
                if (this_00 == (ON_SubDEdge *)0x0) {
                  ON_SubDIncrementErrorCount();
                }
                else {
                  ON_ComponentStatus::ClearRuntimeMark
                            (&(this_00->super_ON_SubDComponentBase).m_status);
                  ON_ComponentStatus::SetRuntimeMark
                            (&(pOVar29->super_ON_SubDComponentBase).m_status);
                  sharpness0 = (double)(float)local_118._0_4_;
                  local_d8 = (ON_SubDVertex *)CONCAT44(local_118._4_4_,local_118._4_4_);
                  fStack_d0 = (float)local_118._4_4_;
                  fStack_cc = (float)local_118._4_4_;
                  if (((float)local_118._0_4_ != (float)local_118._4_4_) ||
                     (NAN((float)local_118._0_4_) || NAN((float)local_118._4_4_))) {
                    dVar9 = ((double)(float)local_118._4_4_ + sharpness0) * 0.5;
                    local_118._0_8_ = dVar9;
                    dVar9 = ON_SubDEdgeSharpness::Sanitize(dVar9,0.0);
                    OVar8 = ON_SubDEdgeSharpness::FromInterval(sharpness0,dVar9);
                    ON_SubDEdge::SetSharpnessForExperts(pOVar29,OVar8);
                    sharpness0 = ON_SubDEdgeSharpness::Sanitize((double)local_118._0_8_,0.0);
                  }
                  else {
                    OVar8 = ON_SubDEdgeSharpness::FromInterval(sharpness0,sharpness0);
                    ON_SubDEdge::SetSharpnessForExperts(pOVar29,OVar8);
                  }
                  OVar8 = ON_SubDEdgeSharpness::FromInterval(sharpness0,(double)(float)local_d8);
                  ON_SubDEdge::SetSharpnessForExperts(this_00,OVar8);
                }
                if (this_00 == (ON_SubDEdge *)0x0) goto LAB_005e7339;
                uVar24 = uVar24 + 1;
              } while (uVar24 != uVar25);
            }
            local_a8._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00825d08;
            local_a8.m_a = (ON_SubDEdgePtr *)0x0;
            local_a8.m_count = 0;
            local_a8.m_capacity = 0;
            ON_SimpleArray<ON_SubDEdgePtr>::SetCapacity(&local_a8,0x20);
            local_c0._vptr_ON_SimpleArray = (_func_int **)local_e0;
            local_c0.m_a = (ON_SubDEdge **)0x0;
            local_c0.m_count = 0;
            local_c0.m_capacity = 0;
            ON_SimpleArray<ON_SubDEdge_*>::SetCapacity(&local_c0,0x20);
            bVar31 = uVar15 == 0;
            if (!bVar31) {
              local_e0 = &this->m_heap;
              uVar25 = 0;
              do {
                pOVar18 = local_48.m_a[uVar25];
                ON_SubDFace::FaceModifiedNofification(pOVar18);
                local_138.x = local_78.m_a[uVar25].x;
                local_138.y = local_78.m_a[uVar25].y;
                local_138.z = local_78.m_a[uVar25].z;
                if (-1 < (long)local_a8._16_8_) {
                  local_a8._16_8_ = local_a8._16_8_ & 0xffffffff00000000;
                }
                uVar14 = ON_SubDFace::GetEdgeArray(pOVar18,&local_a8);
                pOVar20 = local_a8.m_a;
                if ((uVar14 < 6) || ((uVar14 & 1) != 0)) {
                  ON_SubDIncrementErrorCount();
                  goto LAB_005e7349;
                }
                uVar24 = (local_a8.m_a)->m_ptr & 0xfffffffffffffff8;
                if ((uVar24 != 0) &&
                   (uVar15 = (uint)(local_a8.m_a)->m_ptr,
                   *(long *)(uVar24 + 0x80 + (ulong)(uVar15 & 1) * 8) != 0)) {
                  bVar32 = ON_ComponentStatus::RuntimeMark
                                     ((ON_ComponentStatus *)
                                      (*(long *)(uVar24 + 0x80 + (ulong)(uVar15 & 1) * 8) + 0x10));
                  if (!bVar32) {
                    ON_SimpleArray<ON_SubDEdgePtr>::Append(&local_a8,pOVar20);
                    pOVar20 = local_a8.m_a + 1;
                  }
                }
                uVar15 = (pOVar18->super_ON_SubDComponentBase).m_id;
                local_d8 = (ON_SubDVertex *)
                           CONCAT62(local_d8._2_6_,(pOVar18->super_ON_SubDComponentBase).m_status);
                local_118._4_4_ = 0;
                local_118._0_4_ = uVar14;
                uVar24 = 0;
                do {
                  uVar21 = pOVar20[uVar24].m_ptr & 0xfffffffffffffff8;
                  if (uVar21 == 0) {
                    ON_SubDIncrementErrorCount();
                    goto LAB_005e7349;
                  }
                  uVar13 = (uint)pOVar20[uVar24].m_ptr & 1;
                  lVar28 = *(long *)(uVar21 + 0x80 + (ulong)uVar13 * 8);
                  lVar6 = *(long *)(uVar21 + 0x80 + (ulong)(uVar13 ^ 1) * 8);
                  if (((lVar28 == lVar6) || (lVar28 == 0)) || (lVar6 == 0)) {
LAB_005e733d:
                    ON_SubDIncrementErrorCount();
                    goto LAB_005e7349;
                  }
                  if ((uVar24 & 1) == 0) {
                    bVar32 = ON_ComponentStatus::RuntimeMark((ON_ComponentStatus *)(lVar28 + 0x10));
                    if ((!bVar32) ||
                       (bVar32 = ON_ComponentStatus::RuntimeMark
                                           ((ON_ComponentStatus *)(lVar6 + 0x10)), bVar32))
                    goto LAB_005e733d;
                  }
                  else {
                    bVar32 = ON_ComponentStatus::RuntimeMark((ON_ComponentStatus *)(lVar28 + 0x10));
                    if ((bVar32) ||
                       (bVar32 = ON_ComponentStatus::RuntimeMark
                                           ((ON_ComponentStatus *)(lVar6 + 0x10)), !bVar32))
                    goto LAB_005e733d;
                  }
                  uVar24 = uVar24 + 1;
                } while (uVar14 + (uVar14 == 0) != uVar24);
                if (pOVar18->m_edge_count != 0) {
                  uVar21 = 0;
                  do {
                    ON_SubDEdge::RemoveFaceFromArray
                              ((ON_SubDEdge *)(pOVar20[uVar21].m_ptr & 0xfffffffffffffff8),pOVar18);
                    ON_SubDVertex::RemoveFaceFromArray
                              (*(ON_SubDVertex **)
                                ((pOVar20[uVar21].m_ptr & 0xfffffffffffffff8) + 0x80 +
                                (ulong)((uint)pOVar20[uVar21].m_ptr & 1) * 8),pOVar18);
                    uVar21 = uVar21 + 1;
                  } while (uVar21 < pOVar18->m_edge_count);
                }
                ReturnFace(this,pOVar18);
                pOVar17 = ON_SubDHeap::AllocateVertexAndSetId(local_e0,0);
                if (uVar26 < 0x100) {
                  (pOVar17->super_ON_SubDComponentBase).m_level = (uchar)uVar27;
                }
                pOVar17->m_vertex_tag = Smooth;
                pOVar17->m_P[0] = local_138.x;
                pOVar17->m_P[1] = local_138.y;
                pOVar17->m_P[2] = local_138.z;
                AddVertexToLevel(this,pOVar17);
                iVar12 = local_c0.m_capacity;
                if (-1 < (long)local_c0._16_8_) {
                  local_c0._16_8_ = (ulong)(uint)local_c0.m_capacity << 0x20;
                }
                local_c8 = (ulong)(uVar14 >> 1);
                if ((uint)iVar12 < uVar14 >> 1) {
                  ON_SimpleArray<ON_SubDEdge_*>::SetCapacity(&local_c0,local_c8);
                }
                uVar21 = 0;
                do {
                  uVar22 = pOVar20[uVar21].m_ptr & 0xfffffffffffffff8;
                  if (uVar22 == 0) {
                    v1 = (ON_SubDVertex *)0x0;
                  }
                  else {
                    v1 = *(ON_SubDVertex **)
                          (uVar22 + 0x80 + (ulong)(~(uint)pOVar20[uVar21].m_ptr & 1) * 8);
                  }
                  local_108.x = (double)AddEdge(this,0,Smooth,pOVar17,-8883.0,v1,-8883.0,0);
                  ON_SimpleArray<ON_SubDEdge_*>::Append(&local_c0,(ON_SubDEdge **)&local_108);
                  uVar21 = uVar21 + 2;
                } while (uVar21 < (ulong)local_118._0_8_);
                iVar12 = local_118._0_4_;
                uVar21 = 0;
                pOVar18 = (ON_SubDFace *)local_c0.m_a[(int)local_c8 - 1];
                do {
                  pOVar7 = *(ON_SubDFace **)((long)local_c0.m_a + uVar21 * 4);
                  local_108.y = (double)pOVar20[(ulong)(uint)(iVar12 + -1 + (int)uVar21) %
                                                (ulong)uVar14].m_ptr;
                  local_108.z = (double)pOVar20[uVar21].m_ptr;
                  local_f0 = (ulong)pOVar7 | 1;
                  local_108.x = (double)pOVar18;
                  pOVar18 = AddFace(this,uVar15,4,(ON_SubDEdgePtr *)&local_108);
                  (pOVar18->super_ON_SubDComponentBase).m_status = local_d8._0_2_;
                  uVar21 = uVar21 + 2;
                  uVar15 = 0;
                  pOVar18 = pOVar7;
                } while (uVar21 < (ulong)local_118._0_8_);
                if (uVar24 < (ulong)local_118._0_8_) goto LAB_005e7349;
                uVar25 = uVar25 + 1;
                bVar31 = sVar23 <= uVar25;
              } while (uVar25 != sVar23);
            }
            pOVar30 = local_120;
            ON_SubDLevel::ClearRuntimeMarks(local_120,true,true,false);
            (pOVar30->m_aggregates).m_bDirtyBoundingBox = true;
            ON_SubDLevel::ClearEvaluationCache(pOVar30);
            (pOVar30->m_aggregates).m_bDirtyEdgeAttributes = true;
            if (this->m_active_level != (ON_SubDLevel *)0x0) {
              ON_SubDLevel::UpdateAllTagsAndSectorCoefficients(this->m_active_level,true);
            }
LAB_005e7349:
            ON_SimpleArray<ON_SubDEdge_*>::~ON_SimpleArray(&local_c0);
            ON_SimpleArray<ON_SubDEdgePtr>::~ON_SimpleArray(&local_a8);
          }
          else {
            ON_SubDIncrementErrorCount();
LAB_005e7339:
            bVar31 = false;
          }
          ON_SimpleArray<ON_SubDEdge_*>::~ON_SimpleArray(&local_60);
          ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_90);
        }
        else {
          ON_SubDIncrementErrorCount();
LAB_005e7330:
          bVar31 = false;
        }
        ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_78);
        ON_SimpleArray<ON_SubDFace_*>::~ON_SimpleArray(&local_48);
        return bVar31;
      }
    }
    ON_SubDIncrementErrorCount();
  }
  return false;
}

Assistant:

bool ON_SubDimple::LocalSubdivide(
  ON_SubDFace const*const* face_list,
  size_t face_list_count
)
{
  if (nullptr == face_list || face_list_count < 1 || m_levels.UnsignedCount() < 1)
    return false;

  unsigned int level0_index = ON_UNSET_UINT_INDEX;
  for (size_t i = 0; i < face_list_count; ++i)
  {
    const ON_SubDFace* f = face_list[i];
    if (nullptr == f || f->m_edge_count < 3 || f->SubdivisionLevel() >= m_levels.UnsignedCount())
      continue;
    level0_index = f->SubdivisionLevel();
    break;
  }
  
  if (level0_index >= m_levels.UnsignedCount() || nullptr == m_levels[level0_index])
    return ON_SUBD_RETURN_ERROR(false);

  ClearHigherSubdivisionLevels(level0_index + 1);
  if (level0_index + 1 != m_levels.UnsignedCount())
    return ON_SUBD_RETURN_ERROR(false);

  m_active_level = m_levels[level0_index];
  if ( nullptr == m_active_level || 0 == m_active_level->m_face_count)
    return ON_SUBD_RETURN_ERROR(false);

  ON_SubDLevel& level0 = *m_levels[level0_index];
  m_active_level = &level0;

  level0.ClearRuntimeMarks(true, true, true);

  unsigned face_count = 0;
  unsigned edge_count = 0;
  unsigned vertex_count = 0;
  ON_3dPoint P;
  for (size_t i = 0; i < face_list_count; ++i)
  {
    const ON_SubDFace* f = face_list[i];
    if (nullptr == f || f->m_edge_count < 3 || level0_index != f->SubdivisionLevel() )
      continue;
    if (f->m_status.RuntimeMark())
      continue;
    f->m_status.SetRuntimeMark();
    if ( false == f->GetSubdivisionPoint(P))
      return ON_SUBD_RETURN_ERROR(false);
    const ON_SubDEdgePtr* eptr = f->m_edge4;
    for (unsigned short fei = 0; fei < f->m_edge_count; ++fei, ++eptr)
    {
      if (4 == fei)
      {
        eptr = f->m_edgex;
        if (nullptr == eptr)
          return ON_SUBD_RETURN_ERROR(false);
      }
      ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(eptr->m_ptr);
      if (nullptr == e || nullptr == e->m_vertex[0] || nullptr == e->m_vertex[1])
        return ON_SUBD_RETURN_ERROR(false);
      if (e->m_status.RuntimeMark())
        continue;
      e->UpdateEdgeSectorCoefficientsForExperts(true);
      e->m_status.SetRuntimeMark();
      if (false == e->GetSubdivisionPoint(P))
        return ON_SUBD_RETURN_ERROR(false);
      for (unsigned evi = 0; evi < 2; ++evi)
      {
        if (e->m_vertex[evi]->m_status.RuntimeMark())
          continue;
        e->m_vertex[evi]->m_status.SetRuntimeMark();
        if ( false == e->m_vertex[evi]->GetSubdivisionPoint(P) )
          return ON_SUBD_RETURN_ERROR(false);
        ++vertex_count;
      }
      ++edge_count;
    }
    ++face_count;
  }
  if (face_count < 1 || edge_count < 3 || vertex_count < 3)
    return false;
  if (face_count >= level0.m_face_count)
    return GlobalSubdivide();

  // Get face subdivision points
  ON_SimpleArray<ON_SubDFace*> faces(face_count);
  ON_SimpleArray<ON_3dPoint> face_points(face_count);

  // this subd is being modified.
  ChangeGeometryContentSerialNumber( false);

  for (const ON_SubDFace* f0 = level0.m_face[0]; nullptr != f0; f0 = f0->m_next_face)
  {
    if (false == f0->m_status.RuntimeMark())
      continue;
    faces.Append(const_cast<ON_SubDFace*>(f0));
    P = f0->SubdivisionPoint();
    if ( false == P.IsValid())
      return ON_SUBD_RETURN_ERROR(false);
    face_points.Append(P);
  }
  if (face_count != face_points.UnsignedCount())
    return ON_SUBD_RETURN_ERROR(false);

  // Get edge subdivision points
  ON_SimpleArray<ON_3dPoint> edge_points(edge_count);
  ON_SimpleArray<ON_SubDEdge*> edges(edge_count);
  for (const ON_SubDEdge* e0 = level0.m_edge[0]; nullptr != e0; e0 = e0->m_next_edge)
  {
    if (false == e0->m_status.RuntimeMark())
      continue;
    P = (e0->IsSmooth() && 2 == e0->m_face_count && 2 == e0->MarkedFaceCount()) ? e0->SubdivisionPoint() : e0->ControlNetCenterPoint();
    edge_points.Append(P);
    edges.Append(const_cast<ON_SubDEdge*>(e0));
  }
  if ( edge_count != edge_points.UnsignedCount())
    return ON_SUBD_RETURN_ERROR(false);

  // Set vertex points
  for (const ON_SubDVertex* v0 = level0.m_vertex[0]; nullptr != v0; v0 = v0->m_next_vertex)
  {
    if (false == v0->m_status.RuntimeMark() || v0->m_edge_count < 2 || ((unsigned)v0->m_edge_count) != v0->MarkedEdgeCount())
      continue;
    P = v0->SubdivisionPoint();
    ON_SubDVertex* v = const_cast<ON_SubDVertex*>(v0);
    v->m_P[0] = P.x;
    v->m_P[1] = P.y;
    v->m_P[2] = P.z;
  }

  // split edges
  for (unsigned edex = 0; edex < edge_count; ++edex)
  {
    ON_SubDEdge* e = edges[edex];

    const ON_SubDEdgeSharpness e_sharpness = e->Sharpness(false);

    e->EdgeModifiedNofification();
    const ON_SubDEdge* new_edge = SplitEdge(e, edge_points[edex]);
    if (nullptr == new_edge)
      return ON_SUBD_RETURN_ERROR(false);
    new_edge->m_status.ClearRuntimeMark();
    e->m_status.SetRuntimeMark();

    // LOCAL subdivide is more of an add control points to an existing level
    // as opposed to a global subdivision level operation. It will be common
    // for the input to include some but not all sharp edges.
    // Dale Lear's best guess on Nov 9, 2022 is that
    // reusing the original sharpness is the best way to maximize overall
    // user happiness. This makes some sense because the level of the edges
    // is not changing in a LOCAL subdivide. 
    // It is a near certainty that some users will not like this in some cases. 
    const_cast<ON_SubDEdge*>(e)->SetSharpnessForExperts(ON_SubDEdgeSharpness::FromInterval(e_sharpness[0], e_sharpness.Average()));
    const_cast<ON_SubDEdge*>(new_edge)->SetSharpnessForExperts(ON_SubDEdgeSharpness::FromInterval(e_sharpness.Average(), e_sharpness[1]));
  }

  ON_SimpleArray<ON_SubDEdgePtr> fbdry(32);
  ON_SimpleArray<ON_SubDEdge*> radial_edges(32);
  for (unsigned fdex = 0; fdex < face_count; ++fdex)
  {
    ON_SubDFace* f = faces[fdex];
    f->FaceModifiedNofification();
    P = face_points[fdex];
    fbdry.SetCount(0);
    const unsigned e_count = f->GetEdgeArray(fbdry);
    if (e_count < 6 || 0 != e_count %2)
      return ON_SUBD_RETURN_ERROR(false);

    // Get edges[] with edge[0] = marked edges.
    const ON_SubDEdgePtr* eptrs = fbdry.Array();
    if (nullptr != eptrs[0].RelativeVertex(0) && false == eptrs[0].RelativeVertex(0)->Mark() )
    {
      fbdry.Append(eptrs[0]);
      eptrs = fbdry.Array() + 1;
    }

    // save face status and candidate_face
    unsigned int candidate_face_id = f->m_id;
    const ON_ComponentStatus fstatus = f->m_status;

    for (unsigned fei = 0; fei < e_count; ++fei)
    {
      ON_SubDEdge* e = eptrs[fei].Edge();
      if ( nullptr == e)
        return ON_SUBD_RETURN_ERROR(false);
      const ON_SubDVertex* ev[2] = { eptrs[fei].RelativeVertex(0), eptrs[fei].RelativeVertex(1) };
      if ( nullptr == ev[0] || nullptr == ev[1] || ev[0] == ev[1])
        return ON_SUBD_RETURN_ERROR(false);
      if (0 == fei % 2)
      {
        if (false == ev[0]->Mark())
          return ON_SUBD_RETURN_ERROR(false);
        if (ev[1]->Mark())
          return ON_SUBD_RETURN_ERROR(false);
      }
      else
      {
        if (ev[0]->Mark())
          return ON_SUBD_RETURN_ERROR(false);
        if (false == ev[1]->Mark())
          return ON_SUBD_RETURN_ERROR(false);
      }
    }

    // remove face that will be subdivided;
    for (unsigned short fei = 0; fei < f->m_edge_count; ++fei)
    {
      eptrs[fei].Edge()->RemoveFaceFromArray(f);
      const_cast<ON_SubDVertex*>(eptrs[fei].RelativeVertex(0))->RemoveFaceFromArray(f);
    }
    ReturnFace(f);
    
    ON_SubDVertex* center = AllocateVertex(ON_SubDVertexTag::Smooth, level0_index, &P.x);
    AddVertexToLevel(center);

    radial_edges.SetCount(0);
    radial_edges.Reserve(e_count /2);
    for (unsigned fei = 0; fei < e_count; fei += 2)
    {
      ON_SubDEdge* r = AddEdge(ON_SubDEdgeTag::Smooth, center, ON_SubDSectorType::UnsetSectorCoefficient, const_cast<ON_SubDVertex*>(eptrs[fei].RelativeVertex(1)), ON_SubDSectorType::UnsetSectorCoefficient);
      radial_edges.Append(r);
    }

    ON_SubDEdge* r[2] = { nullptr,radial_edges[e_count / 2 - 1] };
    for (unsigned fei = 0; fei < e_count; fei += 2)
    {
      r[0] = r[1];
      r[1] = radial_edges[fei / 2];
      const ON_SubDEdgePtr qbdry[4] = {
        ON_SubDEdgePtr::Create(r[0],0),
        eptrs[(fei + e_count - 1) % e_count],
        eptrs[fei],
        ON_SubDEdgePtr::Create(r[1],1) 
      };
      ON_SubDFace* q = AddFace(candidate_face_id, 4, qbdry);
      candidate_face_id = 0;
      q->m_status = fstatus;
    }

  }

  level0.ClearRuntimeMarks(true, true, false);
  level0.ClearBoundingBox();
  level0.ClearEvaluationCache();
  level0.ClearEdgeFlags();

  if (nullptr != m_active_level)
    m_active_level->UpdateAllTagsAndSectorCoefficients(true);
  
  return true; 
}